

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_stroke_circle
               (nk_draw_list *list,nk_vec2 center,float radius,nk_color col,uint segs,
               float thickness)

{
  float in_EDX;
  nk_color in_ESI;
  nk_draw_list *in_RDI;
  nk_draw_list_stroke in_XMM1_Da;
  float a_max;
  undefined4 in_stack_00000018;
  
  if ((in_RDI != (nk_draw_list *)0x0) && (in_ESI.a != '\0')) {
    nk_draw_list_path_arc_to
              ((nk_draw_list *)CONCAT44(col,in_stack_00000018),center,list._4_4_,list._0_4_,radius,
               segs);
    nk_draw_list_path_stroke(in_RDI,in_ESI,in_XMM1_Da,in_EDX);
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_stroke_circle(struct nk_draw_list *list, struct nk_vec2 center,
float radius, struct nk_color col, unsigned int segs, float thickness)
{
float a_max;
NK_ASSERT(list);
if (!list || !col.a) return;
a_max = NK_PI * 2.0f * ((float)segs - 1.0f) / (float)segs;
nk_draw_list_path_arc_to(list, center, radius, 0.0f, a_max, segs);
nk_draw_list_path_stroke(list, col, NK_STROKE_CLOSED, thickness);
}